

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_WriteTimingInfo(FILE *pFile,Abc_Ntk_t *pNtk)

{
  float fVar1;
  float fVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  Abc_Time_t *pAVar5;
  Abc_Time_t *pAVar6;
  Abc_Time_t *pAVar7;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    return;
  }
  fputc(10,(FILE *)pFile);
  fVar1 = pNtk->AndGateDelay;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fprintf((FILE *)pFile,".and_gate_delay %g\n",(double)fVar1);
  }
  pAVar5 = Abc_NtkReadDefaultArrival(pNtk);
  fprintf((FILE *)pFile,".default_input_arrival %g %g\n",(double)pAVar5->Rise,(double)pAVar5->Fall);
  pAVar6 = Abc_NtkReadDefaultRequired(pNtk);
  fprintf((FILE *)pFile,".default_output_required %g %g\n",(double)pAVar6->Rise,(double)pAVar6->Fall
         );
  fputc(10,(FILE *)pFile);
  pVVar9 = pNtk->vPis;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
      pAVar7 = Abc_NodeReadArrival(pAVar3);
      if ((pAVar7->Rise != pAVar5->Rise) || (NAN(pAVar7->Rise) || NAN(pAVar5->Rise))) {
LAB_0033ebbe:
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
        fprintf((FILE *)pFile,".input_arrival %s %g %g\n",(double)pAVar7->Rise,(double)pAVar7->Fall,
                pcVar8);
      }
      else if ((pAVar7->Fall != pAVar5->Fall) || (NAN(pAVar7->Fall) || NAN(pAVar5->Fall)))
      goto LAB_0033ebbe;
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk->vPis;
    } while (lVar10 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vPos;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar9->pArray[lVar10];
      pAVar5 = Abc_NodeReadRequired(pAVar3);
      if ((pAVar5->Rise != pAVar6->Rise) || (NAN(pAVar5->Rise) || NAN(pAVar6->Rise))) {
LAB_0033ec54:
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
        fprintf((FILE *)pFile,".output_required %s %g %g\n",(double)pAVar5->Rise,
                (double)pAVar5->Fall,pcVar8);
      }
      else if ((pAVar5->Fall != pAVar6->Fall) || (NAN(pAVar5->Fall) || NAN(pAVar6->Fall)))
      goto LAB_0033ec54;
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar10 < pVVar9->nSize);
  }
  fputc(10,(FILE *)pFile);
  pAVar5 = Abc_NtkReadDefaultInputDrive(pNtk);
  fVar1 = pAVar5->Rise;
  fVar2 = pAVar5->Fall;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar2 != 0.0)) || (NAN(fVar2))) {
    fprintf((FILE *)pFile,".default_input_drive %g %g\n",(double)fVar1,(double)fVar2);
  }
  pAVar6 = Abc_NodeReadInputDrive(pNtk,0);
  if ((pAVar6 != (Abc_Time_t *)0x0) && (pVVar9 = pNtk->vPis, 0 < pVVar9->nSize)) {
    lVar10 = 0;
    do {
      plVar4 = (long *)pVVar9->pArray[lVar10];
      pAVar6 = Abc_NodeReadInputDrive(pNtk,(int)lVar10);
      if ((pAVar6->Rise != pAVar5->Rise) || (NAN(pAVar6->Rise) || NAN(pAVar5->Rise))) {
LAB_0033ed4d:
        pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)plVar4[6] * 8));
        fprintf((FILE *)pFile,".input_drive %s %g %g\n",(double)pAVar6->Rise,(double)pAVar6->Fall,
                pcVar8);
      }
      else if ((pAVar6->Fall != pAVar5->Fall) || (NAN(pAVar6->Fall) || NAN(pAVar5->Fall)))
      goto LAB_0033ed4d;
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk->vPis;
    } while (lVar10 < pVVar9->nSize);
  }
  pAVar5 = Abc_NtkReadDefaultOutputLoad(pNtk);
  fVar1 = pAVar5->Rise;
  fVar2 = pAVar5->Fall;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar2 != 0.0)) || (NAN(fVar2))) {
    fprintf((FILE *)pFile,".default_output_load %g %g\n",(double)fVar1,(double)fVar2);
  }
  pAVar6 = Abc_NodeReadOutputLoad(pNtk,0);
  if ((pAVar6 != (Abc_Time_t *)0x0) && (pVVar9 = pNtk->vPos, 0 < pVVar9->nSize)) {
    lVar10 = 0;
    do {
      plVar4 = (long *)pVVar9->pArray[lVar10];
      pAVar6 = Abc_NodeReadOutputLoad(pNtk,(int)lVar10);
      if ((pAVar6->Rise != pAVar5->Rise) || (NAN(pAVar6->Rise) || NAN(pAVar5->Rise))) {
LAB_0033ee33:
        pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)plVar4[4] * 8));
        fprintf((FILE *)pFile,".output_load %s %g %g\n",(double)pAVar6->Rise,(double)pAVar6->Fall,
                pcVar8);
      }
      else if ((pAVar6->Fall != pAVar5->Fall) || (NAN(pAVar6->Fall) || NAN(pAVar5->Fall)))
      goto LAB_0033ee33;
      lVar10 = lVar10 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar10 < pVVar9->nSize);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteTimingInfo( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Abc_Time_t * pTime, * pTimeDefIn, * pTimeDefOut;
    int i;

    if ( pNtk->pManTime == NULL )
        return;

    fprintf( pFile, "\n" );
    if ( pNtk->AndGateDelay != 0.0 )
        fprintf( pFile, ".and_gate_delay %g\n", pNtk->AndGateDelay );
    pTimeDefIn = Abc_NtkReadDefaultArrival( pNtk );
    //if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_arrival %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    pTimeDefOut = Abc_NtkReadDefaultRequired( pNtk );
    //if ( pTimeDefOut->Rise != ABC_INFINITY || pTimeDefOut->Fall != ABC_INFINITY )
        fprintf( pFile, ".default_output_required %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );

    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadArrival(pNode);
        if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
            continue;
        fprintf( pFile, ".input_arrival %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
    }
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadRequired(pNode);
        if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
            continue;
        fprintf( pFile, ".output_required %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
    }

    fprintf( pFile, "\n" );
    pTimeDefIn = Abc_NtkReadDefaultInputDrive( pNtk );
    if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_drive %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    if ( Abc_NodeReadInputDrive( pNtk, 0 ) )
        Abc_NtkForEachPi( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadInputDrive( pNtk, i );
            if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
                continue;
            fprintf( pFile, ".input_drive %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
        }

    pTimeDefOut = Abc_NtkReadDefaultOutputLoad( pNtk );
    if ( pTimeDefOut->Rise != 0.0 || pTimeDefOut->Fall != 0.0 )
        fprintf( pFile, ".default_output_load %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );
    if ( Abc_NodeReadOutputLoad( pNtk, 0 ) )
        Abc_NtkForEachPo( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadOutputLoad( pNtk, i );
            if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
                continue;
            fprintf( pFile, ".output_load %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
        }

    fprintf( pFile, "\n" );
}